

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int __thiscall
ON__CChangeTextureCoordinateHelper::DupVertex(ON__CChangeTextureCoordinateHelper *this,int vi)

{
  bool bVar1;
  float fVar2;
  int iVar3;
  ON_MeshFace *pOVar4;
  uint *puVar5;
  ON_3fPoint *pOVar6;
  ON_3fPoint *pOVar7;
  ON_3dPoint *pOVar8;
  ON_3dPoint *pOVar9;
  ON_2fPoint *pOVar10;
  ON_2fPoint *pOVar11;
  ON_3fVector *pOVar12;
  ON_3fVector *pOVar13;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar14;
  anon_union_4_2_6147a14e_for_ON_Color_15 *paVar15;
  ON_2dPoint *pOVar16;
  ON_2dPoint *pOVar17;
  ON_SurfaceCurvature *pOVar18;
  ON_SurfaceCurvature *pOVar19;
  bool *pbVar20;
  ON_TextureCoordinates **ppOVar21;
  ON_SimpleArray<ON_3fPoint> *this_00;
  ON_SimpleArray<ON_3fPoint> *T;
  int i_1;
  int tccount;
  int i;
  int *Fvi;
  int fi;
  int vi_local;
  ON__CChangeTextureCoordinateHelper *this_local;
  
  if (this->m_vuse_count == 0) {
    iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>)
    ;
    this->m_vuse_count = iVar3;
    ON_SimpleArray<unsigned_int>::Reserve(&this->m_vuse,(long)this->m_vuse_count);
    ON_SimpleArray<unsigned_int>::SetCount(&this->m_vuse,this->m_vuse_count);
    ON_SimpleArray<unsigned_int>::Zero(&this->m_vuse);
    for (Fvi._0_4_ = 0; iVar3 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_mesh->m_F),
        (int)Fvi < iVar3; Fvi._0_4_ = (int)Fvi + 1) {
      pOVar4 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,(int)Fvi);
      iVar3 = pOVar4->vi[0];
      if ((-1 < iVar3) && (iVar3 < this->m_vuse_count)) {
        puVar5 = ON_SimpleArray<unsigned_int>::operator[](&this->m_vuse,iVar3);
        *puVar5 = *puVar5 + 1;
      }
      iVar3 = pOVar4->vi[1];
      if ((-1 < iVar3) && (iVar3 < this->m_vuse_count)) {
        puVar5 = ON_SimpleArray<unsigned_int>::operator[](&this->m_vuse,iVar3);
        *puVar5 = *puVar5 + 1;
      }
      iVar3 = pOVar4->vi[2];
      if ((-1 < iVar3) && (iVar3 < this->m_vuse_count)) {
        puVar5 = ON_SimpleArray<unsigned_int>::operator[](&this->m_vuse,iVar3);
        *puVar5 = *puVar5 + 1;
      }
      iVar3 = pOVar4->vi[3];
      if (((pOVar4->vi[2] != iVar3) && (-1 < iVar3)) && (iVar3 < this->m_vuse_count)) {
        puVar5 = ON_SimpleArray<unsigned_int>::operator[](&this->m_vuse,iVar3);
        *puVar5 = *puVar5 + 1;
      }
    }
  }
  if ((-1 < vi) && (vi < this->m_vuse_count)) {
    puVar5 = ON_SimpleArray<unsigned_int>::operator[](&this->m_vuse,vi);
    if (*puVar5 < 2) {
      return vi;
    }
    puVar5 = ON_SimpleArray<unsigned_int>::operator[](&this->m_vuse,vi);
    *puVar5 = *puVar5 - 1;
  }
  ON_SimpleArray<ON_3fPoint>::AppendNew(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  pOVar6 = ON_SimpleArray<ON_3fPoint>::operator[]
                     (&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,vi);
  pOVar7 = ON_SimpleArray<ON_3fPoint>::Last(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  fVar2 = pOVar6->y;
  pOVar7->x = pOVar6->x;
  pOVar7->y = fVar2;
  pOVar7->z = pOVar6->z;
  if (this->m_mesh_dV != (ON_3dPointArray *)0x0) {
    ON_SimpleArray<ON_3dPoint>::AppendNew(&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>);
    pOVar8 = ON_SimpleArray<ON_3dPoint>::operator[]
                       (&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>,vi);
    pOVar9 = ON_SimpleArray<ON_3dPoint>::Last(&this->m_mesh_dV->super_ON_SimpleArray<ON_3dPoint>);
    pOVar9->x = pOVar8->x;
    pOVar9->y = pOVar8->y;
    pOVar9->z = pOVar8->z;
  }
  if ((this->m_bHasVertexTextures & 1U) != 0) {
    ON_SimpleArray<ON_2fPoint>::AppendNew(&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
    pOVar10 = ON_SimpleArray<ON_2fPoint>::operator[]
                        (&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,vi);
    pOVar11 = ON_SimpleArray<ON_2fPoint>::Last
                        (&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
    *pOVar11 = *pOVar10;
  }
  if ((this->m_bHasVertexNormals & 1U) != 0) {
    ON_SimpleArray<ON_3fVector>::AppendNew(&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>);
    pOVar12 = ON_SimpleArray<ON_3fVector>::operator[]
                        (&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>,vi);
    pOVar13 = ON_SimpleArray<ON_3fVector>::Last
                        (&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>);
    fVar2 = pOVar12->y;
    pOVar13->x = pOVar12->x;
    pOVar13->y = fVar2;
    pOVar13->z = pOVar12->z;
  }
  if ((this->m_bHasVertexColors & 1U) != 0) {
    ON_SimpleArray<ON_Color>::AppendNew(&this->m_mesh->m_C);
    paVar14 = &ON_SimpleArray<ON_Color>::operator[](&this->m_mesh->m_C,vi)->field_0;
    paVar15 = &ON_SimpleArray<ON_Color>::Last(&this->m_mesh->m_C)->field_0;
    *paVar15 = *paVar14;
  }
  if ((this->m_bHasSurfaceParameters & 1U) != 0) {
    ON_SimpleArray<ON_2dPoint>::AppendNew(&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
    pOVar16 = ON_SimpleArray<ON_2dPoint>::operator[]
                        (&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,vi);
    pOVar17 = ON_SimpleArray<ON_2dPoint>::Last
                        (&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>);
    pOVar17->x = pOVar16->x;
    pOVar17->y = pOVar16->y;
  }
  if ((this->m_bHasPrincipalCurvatures & 1U) != 0) {
    ON_SimpleArray<ON_SurfaceCurvature>::AppendNew(&this->m_mesh->m_K);
    pOVar18 = ON_SimpleArray<ON_SurfaceCurvature>::operator[](&this->m_mesh->m_K,vi);
    pOVar19 = ON_SimpleArray<ON_SurfaceCurvature>::Last(&this->m_mesh->m_K);
    pOVar19->k1 = pOVar18->k1;
    pOVar19->k2 = pOVar18->k2;
  }
  if ((this->m_bHasHiddenVertices & 1U) != 0) {
    ON_SimpleArray<bool>::AppendNew(&this->m_mesh->m_H);
    pbVar20 = ON_SimpleArray<bool>::operator[](&this->m_mesh->m_H,vi);
    bVar1 = *pbVar20;
    pbVar20 = ON_SimpleArray<bool>::Last(&this->m_mesh->m_H);
    *pbVar20 = (bool)(bVar1 & 1);
    if ((bVar1 & 1U) != 0) {
      this->m_mesh->m_hidden_count = this->m_mesh->m_hidden_count + 1;
    }
  }
  if ((this->m_bHasCachedTextures & 1U) != 0) {
    iVar3 = ON_SimpleArray<ON_TextureCoordinates_*>::Count(&this->m_TC);
    for (T._4_4_ = 0; T._4_4_ < iVar3; T._4_4_ = T._4_4_ + 1) {
      ppOVar21 = ON_SimpleArray<ON_TextureCoordinates_*>::operator[](&this->m_TC,T._4_4_);
      this_00 = &(*ppOVar21)->m_T;
      ON_SimpleArray<ON_3fPoint>::AppendNew(this_00);
      pOVar6 = ON_SimpleArray<ON_3fPoint>::operator[](this_00,vi);
      pOVar7 = ON_SimpleArray<ON_3fPoint>::Last(this_00);
      fVar2 = pOVar6->y;
      pOVar7->x = pOVar6->x;
      pOVar7->y = fVar2;
      pOVar7->z = pOVar6->z;
    }
  }
  iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
  return iVar3 + -1;
}

Assistant:

int ON__CChangeTextureCoordinateHelper::DupVertex(int vi)
{
  if ( 0 == m_vuse_count )
  {
    // m_vuse[] is an array of length = original number of
    // vertices in m_mesh and m_vuse[vi] = number of faces
    // that reference vertex vi. If this vertex needs to be
    // split, vuse[vi] is decremented.  The ultimate goal
    // is to split a few times as needed so we don't
    // bloat the mesh with repeated calls to changing
    // texture maps. m_vuse[] is set the first time
    // DupVertex() is called.
    m_vuse_count = m_mesh.m_V.Count();
    m_vuse.Reserve(m_vuse_count);
    m_vuse.SetCount(m_vuse_count);
    m_vuse.Zero();
    for ( int fi = 0; fi < m_mesh.m_F.Count(); fi++ )
    {
      const int* Fvi = m_mesh.m_F[fi].vi;
      int i = Fvi[0];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[1];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[2];
      if ( i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
      i = Fvi[3];
      if ( Fvi[2] != i && i >= 0 && i < m_vuse_count )
        m_vuse[i]++;
    }
  }

  if ( vi >= 0 && vi < m_vuse_count )
  {
    if ( m_vuse[vi] <= 1 )
      return vi; // only one face uses this vertex - no need to dup the vertex

    // otherwise we will duplicate this vertex, reducing its use count by 1.
    m_vuse[vi]--;
  }


  m_mesh.m_V.AppendNew();
  *m_mesh.m_V.Last() = m_mesh.m_V[vi];
  if ( 0 != m_mesh_dV )
  {
    m_mesh_dV->AppendNew();
    *(m_mesh_dV->Last()) = m_mesh_dV->operator[](vi);
  }
  if ( m_bHasVertexTextures )
  {
    m_mesh.m_T.AppendNew();
    *m_mesh.m_T.Last() = m_mesh.m_T[vi];
  }
  if ( m_bHasVertexNormals )
  {
    m_mesh.m_N.AppendNew();
    *m_mesh.m_N.Last() = m_mesh.m_N[vi];
  }
  if ( m_bHasVertexColors )
  {
    m_mesh.m_C.AppendNew();
    *m_mesh.m_C.Last() = m_mesh.m_C[vi];
  }
  if ( m_bHasSurfaceParameters )
  {
    m_mesh.m_S.AppendNew();
    *m_mesh.m_S.Last() = m_mesh.m_S[vi];
  }
  if ( m_bHasPrincipalCurvatures )
  {
    m_mesh.m_K.AppendNew();
    *m_mesh.m_K.Last() = m_mesh.m_K[vi];
  }
  if ( m_bHasHiddenVertices )
  {
    m_mesh.m_H.AppendNew();
    if ( 0 != (*m_mesh.m_H.Last() = m_mesh.m_H[vi]) )
      m_mesh.m_hidden_count++;
  }

  if ( m_bHasCachedTextures )
  {
    // Note:  This m_TC[] is the subset of m_mesh.m_TC[]
    //        that need to be duped.  The constructor
    //        insures that m_TC[i] is not nullptr and
    //        has the right count and capacity.
    //
    //        DO NOT REFERENCE m_mesh.m_TC[] in this block.
    int tccount = m_TC.Count();
    for ( int i = 0; i < tccount; i++ )
    {
      ON_SimpleArray<ON_3fPoint>& T = m_TC[i]->m_T;
      T.AppendNew();
      *T.Last() = T[vi];
    }
  }

  return m_mesh.m_V.Count()-1;
}